

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O3

void __thiscall
shared_data::update(shared_data *this,bool test_example,bool labeled_example,float loss,float weight
                   ,size_t num_features)

{
  undefined3 in_register_00000011;
  undefined7 in_register_00000031;
  double dVar1;
  double dVar2;
  
  dVar2 = (double)weight;
  this->t = this->t + dVar2;
  if (((uint)CONCAT71(in_register_00000031,test_example) &
      CONCAT31(in_register_00000011,labeled_example)) == 1) {
    this->weighted_holdout_examples = this->weighted_holdout_examples + dVar2;
    this->weighted_holdout_examples_since_last_dump =
         this->weighted_holdout_examples_since_last_dump + dVar2;
    dVar1 = (double)loss;
    this->holdout_sum_loss_since_last_dump = dVar1 + this->holdout_sum_loss_since_last_dump;
    this->holdout_sum_loss = dVar1 + this->holdout_sum_loss;
    this->weighted_holdout_examples_since_last_pass =
         dVar2 + this->weighted_holdout_examples_since_last_pass;
    this->holdout_sum_loss_since_last_pass = dVar1 + this->holdout_sum_loss_since_last_pass;
    return;
  }
  (&this->weighted_labeled_examples)[(ulong)!labeled_example * 2] =
       dVar2 + (&this->weighted_labeled_examples)[(ulong)!labeled_example * 2];
  this->sum_loss = (double)loss + this->sum_loss;
  this->sum_loss_since_last_dump = (double)loss + this->sum_loss_since_last_dump;
  this->example_number = this->example_number + 1;
  this->total_features = num_features + this->total_features;
  return;
}

Assistant:

void update(bool test_example, bool labeled_example, float loss, float weight, size_t num_features)
  {
    t += weight;
    if (test_example && labeled_example)
    {
      weighted_holdout_examples += weight;  // test weight seen
      weighted_holdout_examples_since_last_dump += weight;
      weighted_holdout_examples_since_last_pass += weight;
      holdout_sum_loss += loss;
      holdout_sum_loss_since_last_dump += loss;
      holdout_sum_loss_since_last_pass += loss;  // since last pass
    }
    else
    {
      if (labeled_example)
        weighted_labeled_examples += weight;
      else
        weighted_unlabeled_examples += weight;
      sum_loss += loss;
      sum_loss_since_last_dump += loss;
      total_features += num_features;
      example_number++;
    }
  }